

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_limit.cpp
# Opt level: O0

void __thiscall rate_limit::handle_connected(rate_limit *this,tcp_connection *conn)

{
  ostream *poVar1;
  endpoint local_28 [8];
  endpoint ep;
  tcp_connection *conn_local;
  rate_limit *this_local;
  
  _local_28 = ranger::event::tcp_connection::remote_endpoint();
  poVar1 = std::operator<<((ostream *)&std::cout,"connection[");
  poVar1 = ranger::event::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"] connected.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void handle_connected(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cout << "connection[" << ep << "] connected." << std::endl;
	}